

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_buglist(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  MYSQL *pMVar8;
  long lVar9;
  undefined8 *puVar10;
  char *in_RSI;
  long in_RDI;
  char *pcVar11;
  MYSQL_ROW row;
  MYSQL_RES *res_set;
  MYSQL *conn;
  char str [200];
  char query [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffc898;
  CHAR_DATA *in_stack_ffffffffffffc8a0;
  CHAR_DATA *in_stack_ffffffffffffc8a8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffc8b0;
  char *txt;
  char *in_stack_ffffffffffffc8c8;
  char local_36e8 [208];
  char local_3618 [4608];
  char local_2418 [4608];
  char local_1218 [4616];
  char *local_10;
  long local_8;
  
  if (*in_RSI == '\0') {
    send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
    send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
    send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
    send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
  }
  else {
    local_8 = in_RDI;
    bVar3 = is_npc(in_stack_ffffffffffffc898);
    if (bVar3) {
      send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
    }
    else {
      local_10 = one_argument((char *)in_stack_ffffffffffffc8a0,(char *)in_stack_ffffffffffffc898);
      iVar4 = strcmp(local_1218,"auto");
      if (iVar4 == 0) {
        sprintf(local_3618,"SELECT * from buglist WHERE Status = 0 ORDER BY ID desc LIMIT 8");
        sprintf(local_36e8,"Displaying last 8 unresolved bugs.\n\r");
      }
      else {
        bVar3 = is_number((char *)in_stack_ffffffffffffc898);
        if (bVar3) {
          pMVar8 = open_conn();
          if (pMVar8 != (MYSQL *)0x0) {
            uVar5 = atoi(local_1218);
            sprintf(local_3618,"SELECT * from buglist WHERE ID = %d",(ulong)uVar5);
            uVar5 = atoi(local_1218);
            sprintf(local_36e8,"Displaying bug #%d:\n\r",(ulong)uVar5);
            send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
            mysql_query(pMVar8,local_3618);
            lVar9 = mysql_store_result(pMVar8);
            if ((lVar9 == 0) || (lVar6 = mysql_fetch_row(lVar9), lVar6 == 0)) {
              send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
            }
            else {
              uVar2 = *(undefined8 *)(lVar6 + 8);
              uVar1 = *(undefined8 *)(lVar6 + 0x10);
              iVar4 = atoi(*(char **)(lVar6 + 0x28));
              pcVar7 = "Unresolved";
              if (iVar4 == 1) {
                pcVar7 = "Resolved";
              }
              sprintf(local_3618,
                      "Added by: %-15s Date: %-15s\n\rStatus: %s\n\rSummary: %s\n\rDescription: %s\n\r"
                      ,uVar2,uVar1,pcVar7,*(undefined8 *)(lVar6 + 0x18),
                      *(undefined8 *)(lVar6 + 0x20));
              send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
            }
            mysql_free_result(lVar9);
            mysql_close(pMVar8);
            return;
          }
          send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
          return;
        }
        iVar4 = strcmp(local_1218,"last");
        if (iVar4 != 0) {
          iVar4 = strcmp(local_1218,"add");
          if (iVar4 == 0) {
            pcVar7 = palloc_string(in_stack_ffffffffffffc8c8);
            *(char **)(*(long *)(local_8 + 0xc0) + 0xd58) = pcVar7;
            send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
            enter_text(in_stack_ffffffffffffc8a0,(DO_FUN *)in_stack_ffffffffffffc898);
            return;
          }
          iVar4 = strcmp(local_1218,"done");
          if (iVar4 == 0) {
            local_10 = one_argument((char *)in_stack_ffffffffffffc8a0,
                                    (char *)in_stack_ffffffffffffc898);
            bVar3 = is_number((char *)in_stack_ffffffffffffc898);
            if (!bVar3) {
              send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
              return;
            }
            uVar5 = atoi(local_2418);
            sprintf(local_3618,"UPDATE buglist SET Status = 1 WHERE ID = %d",(ulong)uVar5);
            one_query((char *)in_stack_ffffffffffffc8a0);
            send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
            return;
          }
          send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
          return;
        }
        local_10 = one_argument((char *)in_stack_ffffffffffffc8a0,(char *)in_stack_ffffffffffffc898)
        ;
        bVar3 = is_number((char *)in_stack_ffffffffffffc898);
        if (!bVar3) {
          send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
          return;
        }
        pcVar7 = local_3618;
        uVar5 = atoi(local_2418);
        sprintf(pcVar7,"SELECT * from buglist ORDER BY ID desc LIMIT %d",(ulong)uVar5);
        uVar5 = atoi(local_2418);
        sprintf(local_36e8,"Displaying last %d bugs.\n\r",(ulong)uVar5);
      }
      pMVar8 = open_conn();
      if (pMVar8 == (MYSQL *)0x0) {
        send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
      }
      else {
        send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
        mysql_query(pMVar8,local_3618);
        lVar9 = mysql_store_result(pMVar8);
        if (lVar9 == 0) {
          send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
        }
        else {
          send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
          send_to_char(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
          while (puVar10 = (undefined8 *)mysql_fetch_row(lVar9), puVar10 != (undefined8 *)0x0) {
            pcVar7 = local_3618;
            ch_00 = (CHAR_DATA *)*puVar10;
            txt = (char *)puVar10[1];
            uVar2 = puVar10[3];
            iVar4 = atoi((char *)puVar10[5]);
            pcVar11 = "";
            if (iVar4 == 1) {
              pcVar11 = "(SOLVED)";
            }
            sprintf(pcVar7,"%-5s %-11s %s %s\n\r",ch_00,txt,uVar2,pcVar11);
            send_to_char(txt,ch_00);
          }
        }
        mysql_free_result(lVar9);
        mysql_close(pMVar8);
      }
    }
  }
  return;
}

Assistant:

void do_buglist(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], query[MSL], str[200];
	MYSQL *conn;
	MYSQL_RES *res_set = nullptr;
	MYSQL_ROW row = nullptr;

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  buglist <number>                          - detailed information about bug <number>\n\r", ch);
		send_to_char("         buglist last <number>                     - list <number> most recent bugs\n\r", ch);
		send_to_char("         buglist add <brief one line summary>      - report bug (it prompts for detailed description)\n\r", ch);
		send_to_char("         buglist done <number>                     - mark bug <number> as resolved\n\r", ch);
		return;
	}

	if (is_npc(ch))
	{
		send_to_char("Die.\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	// status 0 = unresolved, 1 = resolved, 2 = my head is on fire
	if (!strcmp(arg1, "auto"))
	{
		sprintf(query, "SELECT * from buglist WHERE Status = 0 ORDER BY ID desc LIMIT 8");
		sprintf(str, "Displaying last 8 unresolved bugs.\n\r");
	}
	else if (is_number(arg1))
	{
		conn = open_conn();

		if (!conn)
		{
			send_to_char("Error opening bug database.\n\r", ch);
			return;
		}

		sprintf(query, "SELECT * from buglist WHERE ID = %d", atoi(arg1));
		sprintf(str, "Displaying bug #%d:\n\r", atoi(arg1));
		send_to_char(str, ch);

		mysql_query(conn, query);

		res_set = mysql_store_result(conn);

		if (!res_set || !(row = mysql_fetch_row(res_set)))
			send_to_char("Unable to find that bug.\n\r", ch);
		else
		{
			sprintf(query, "Added by: %-15s Date: %-15s\n\rStatus: %s\n\rSummary: %s\n\rDescription: %s\n\r",
				row[1],
				row[2],
				atoi(row[5]) == 1 ? "Resolved" : "Unresolved",
				row[3],
				row[4]);
			send_to_char(query, ch);
		}

		mysql_free_result(res_set);
		mysql_close(conn);
		return;
	}
	else if (!strcmp(arg1, "last"))
	{
		argument = one_argument(argument, arg2);

		if (!is_number(arg2))
		{
			send_to_char("Invalid number of last bugs to display.\n\r", ch);
			return;
		}

		sprintf(query, "SELECT * from buglist ORDER BY ID desc LIMIT %d", atoi(arg2));
		sprintf(str, "Displaying last %d bugs.\n\r", atoi(arg2));
	}
	else if (!strcmp(arg1, "add"))
	{
		ch->pcdata->temp_str = palloc_string(argument);

		send_to_char("Please enter a description of the bug with as much information as possible:\n\r", ch);
		enter_text(ch, buglist_end_fun);
		return;
	}
	else if (!strcmp(arg1, "done"))
	{
		argument = one_argument(argument, arg2);

		if (!is_number(arg2))
		{
			send_to_char("Invalid number of bug to complete.\n\r", ch);
			return;
		}

		sprintf(query, "UPDATE buglist SET Status = 1 WHERE ID = %d", atoi(arg2));
		one_query(query);

		send_to_char("Bug marked as resolved.\n\r", ch);

		return;
	}
	else
	{
		send_to_char("Invalid option.\n\r", ch);
		return;
	}

	conn = open_conn();

	if (!conn)
	{
		send_to_char("Error opening bug database.\n\r", ch);
		return;
	}

	send_to_char(str, ch);
	mysql_query(conn, query);

	res_set = mysql_store_result(conn);

	if (!res_set)
	{
		send_to_char("No bugs found.\n\r", ch);
	}
	else
	{
		send_to_char("ID    Added By    Summary\n\r", ch);
		send_to_char("---   ---------   ------------\n\r", ch);

		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			sprintf(query, "%-5s %-11s %s %s\n\r", row[0], row[1], row[3], atoi(row[5]) == 1 ? "(SOLVED)" : "");
			send_to_char(query, ch);
		}
	}

	mysql_free_result(res_set);
	mysql_close(conn);
}